

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void learn<false>(bfgs *b,base_learner *base,example *ec)

{
  float fVar1;
  
  if (b->final_pass < b->current_pass) {
    return;
  }
  fVar1 = (ec->l).simple.label;
  if ((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) {
    predict<false>(b,base,ec);
    return;
  }
  process_example(b->all,b,ec);
  return;
}

Assistant:

void learn(bfgs& b, base_learner& base, example& ec)
{
  vw* all = b.all;
  assert(ec.in_use);

  if (b.current_pass <= b.final_pass)
  {
    if (test_example(ec))
      predict<audit>(b, base, ec);
    else
      process_example(*all, b, ec);
  }
}